

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O2

void icu_63::number::impl::AffixUtils::iterateWithConsumer
               (UnicodeString *affixPattern,TokenConsumer *consumer,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  UErrorCode *in_R8;
  AffixTag AVar4;
  AffixTag tag;
  AffixTag local_40;
  
  AVar4 = local_40;
  sVar1 = (affixPattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (affixPattern->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if (iVar3 != 0) {
    local_40._0_8_ = local_40._4_8_ << 0x20;
    local_40.type = AVar4.type;
    local_40.state = STATE_BASE;
    AVar4 = local_40;
    do {
      bVar2 = hasNext(&local_40,affixPattern);
      if (!bVar2) {
        return;
      }
      tag._8_8_ = affixPattern;
      tag.offset = (int)AVar4._8_8_;
      tag.codePoint = (int)((ulong)AVar4._8_8_ >> 0x20);
      AVar4 = nextToken(AVar4._0_8_,tag,(UnicodeString *)status,in_R8);
      if (U_ZERO_ERROR < *status) {
        return;
      }
      local_40 = AVar4;
      (*consumer->_vptr_TokenConsumer[2])(consumer,AVar4._8_8_ >> 0x20,AVar4._0_8_ >> 0x20,status);
    } while (*status < U_ILLEGAL_ARGUMENT_ERROR);
  }
  return;
}

Assistant:

void AffixUtils::iterateWithConsumer(const UnicodeString& affixPattern, TokenConsumer& consumer,
                                     UErrorCode& status) {
    if (affixPattern.length() == 0) {
        return;
    };
    AffixTag tag;
    while (hasNext(tag, affixPattern)) {
        tag = nextToken(tag, affixPattern, status);
        if (U_FAILURE(status)) { return; }
        consumer.consumeToken(tag.type, tag.codePoint, status);
        if (U_FAILURE(status)) { return; }
    }
}